

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_asymmetric_encrypt
          (psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *input,size_t input_length,
          uint8_t *salt,size_t salt_length,uint8_t *output,size_t output_size,size_t *output_length)

{
  mbedtls_rsa_context *ctx;
  size_t sVar1;
  int local_54;
  int ret;
  mbedtls_rsa_context *rsa;
  psa_key_slot_t *ppStack_40;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t salt_length_local;
  uint8_t *salt_local;
  size_t input_length_local;
  uint8_t *input_local;
  psa_key_handle_t local_e;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  *output_length = 0;
  if (((alg & 0xffffff00) == 0x12030000) || (salt_length == 0)) {
    slot = (psa_key_slot_t *)salt_length;
    salt_length_local = (size_t)salt;
    salt_local = (uint8_t *)input_length;
    input_length_local = (size_t)input;
    input_local._4_4_ = alg;
    local_e = handle;
    alg_local = psa_get_key_from_slot(handle,&stack0xffffffffffffffc0,0x100,alg);
    if (alg_local == 0) {
      if ((((ppStack_40->attr).type & 0x7000) == 0x4000) ||
         (((ppStack_40->attr).type & 0x7000) == 0x7000)) {
        if (((ppStack_40->attr).type & 0xcfff) == 0x4001) {
          ctx = (ppStack_40->data).rsa;
          sVar1 = mbedtls_rsa_get_len(ctx);
          if (output_size < sVar1) {
            alg_local = 0xffffff76;
          }
          else {
            if (input_local._4_4_ == 0x12020000) {
              local_54 = mbedtls_rsa_pkcs1_encrypt
                                   (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,0,
                                    (size_t)salt_local,(uchar *)input_length_local,output);
            }
            else {
              if ((input_local._4_4_ & 0xffffff00) != 0x12030000) {
                return -0x87;
              }
              psa_rsa_oaep_set_padding_mode(input_local._4_4_,ctx);
              local_54 = mbedtls_rsa_rsaes_oaep_encrypt
                                   (ctx,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,0,
                                    (uchar *)salt_length_local,(size_t)slot,(size_t)salt_local,
                                    (uchar *)input_length_local,output);
            }
            if (local_54 == 0) {
              sVar1 = mbedtls_rsa_get_len(ctx);
              *output_length = sVar1;
            }
            alg_local = mbedtls_to_psa_error(local_54);
          }
        }
        else {
          alg_local = 0xffffff7a;
        }
      }
      else {
        alg_local = 0xffffff79;
      }
    }
  }
  else {
    alg_local = 0xffffff79;
  }
  return alg_local;
}

Assistant:

psa_status_t psa_asymmetric_encrypt( psa_key_handle_t handle,
                                     psa_algorithm_t alg,
                                     const uint8_t *input,
                                     size_t input_length,
                                     const uint8_t *salt,
                                     size_t salt_length,
                                     uint8_t *output,
                                     size_t output_size,
                                     size_t *output_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    (void) input;
    (void) input_length;
    (void) salt;
    (void) output;
    (void) output_size;

    *output_length = 0;

    if( ! PSA_ALG_IS_RSA_OAEP( alg ) && salt_length != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    status = psa_get_transparent_key( handle, &slot, PSA_KEY_USAGE_ENCRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );
    if( ! ( PSA_KEY_TYPE_IS_PUBLIC_KEY( slot->attr.type ) ||
            PSA_KEY_TYPE_IS_KEY_PAIR( slot->attr.type ) ) )
        return( PSA_ERROR_INVALID_ARGUMENT );

#if defined(MBEDTLS_RSA_C)
    if( PSA_KEY_TYPE_IS_RSA( slot->attr.type ) )
    {
        mbedtls_rsa_context *rsa = slot->data.rsa;
        int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
        if( output_size < mbedtls_rsa_get_len( rsa ) )
            return( PSA_ERROR_BUFFER_TOO_SMALL );
#if defined(MBEDTLS_PKCS1_V15)
        if( alg == PSA_ALG_RSA_PKCS1V15_CRYPT )
        {
            ret = mbedtls_rsa_pkcs1_encrypt( rsa,
                                             mbedtls_ctr_drbg_random,
                                             &global_data.ctr_drbg,
                                             MBEDTLS_RSA_PUBLIC,
                                             input_length,
                                             input,
                                             output );
        }
        else
#endif /* MBEDTLS_PKCS1_V15 */
#if defined(MBEDTLS_PKCS1_V21)
        if( PSA_ALG_IS_RSA_OAEP( alg ) )
        {
            psa_rsa_oaep_set_padding_mode( alg, rsa );
            ret = mbedtls_rsa_rsaes_oaep_encrypt( rsa,
                                                  mbedtls_ctr_drbg_random,
                                                  &global_data.ctr_drbg,
                                                  MBEDTLS_RSA_PUBLIC,
                                                  salt, salt_length,
                                                  input_length,
                                                  input,
                                                  output );
        }
        else
#endif /* MBEDTLS_PKCS1_V21 */
        {
            return( PSA_ERROR_INVALID_ARGUMENT );
        }
        if( ret == 0 )
            *output_length = mbedtls_rsa_get_len( rsa );
        return( mbedtls_to_psa_error( ret ) );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }
}